

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynet.cc
# Opt level: O0

void __thiscall dynet::ComputationGraph::_revert(ComputationGraph *this,CGCheckpoint p)

{
  pointer ppNVar1;
  int iVar2;
  size_type sVar3;
  reference ppNVar4;
  vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *in_RDI;
  int i;
  int *__new_size;
  undefined4 in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  
  __new_size = (int *)&stack0x00000008;
  (**(code **)(*dynet::default_device + 0x18))(dynet::default_device,&stack0x00000010);
  sVar3 = std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::size(in_RDI);
  if (*__new_size < (int)sVar3) {
    iVar2 = *__new_size;
    while( true ) {
      in_stack_fffffffffffffff4 = iVar2;
      sVar3 = std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::size(in_RDI);
      if ((int)sVar3 <= iVar2) break;
      ppNVar4 = std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::operator[]
                          (in_RDI,(long)in_stack_fffffffffffffff4);
      if (*ppNVar4 != (value_type)0x0) {
        (*(*ppNVar4)->_vptr_Node[1])();
      }
      iVar2 = in_stack_fffffffffffffff4 + 1;
    }
    std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::resize
              ((vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *)
               CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),(size_type)__new_size);
    ppNVar1 = in_RDI[2].super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    (*(code *)((*ppNVar1)->args).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage)(ppNVar1,*__new_size + -1);
  }
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 1));
  if (__new_size[1] < (int)sVar3) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),(size_type)__new_size);
  }
  return;
}

Assistant:

void ComputationGraph::_revert(CGCheckpoint p) {
  default_device->revert(p.device_mem_checkpoint);
  // clear all nodes at position >= p.node_idx
  if ((int)nodes.size() > p.node_idx) {
    for(int i = p.node_idx; i < (int)nodes.size(); i++)
      delete nodes[i]; // the deletion of nodes.
    nodes.resize(p.node_idx);
    ee->invalidate(p.node_idx - 1); // clear precomputed forward values
  }
  // clear all parameter nodes at position >= p.par_node_idx
  if ((int)parameter_nodes.size() > p.par_node_idx) {
    parameter_nodes.resize(p.par_node_idx);
  }
}